

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptConstPeep(GlobOpt *this,Instr *instr,Opnd *constSrc,Value **pDstVal,ValueInfo *valuInfo)

{
  OpCode OVar1;
  code *pcVar2;
  Opnd *pOVar3;
  bool bVar4;
  AddrOpndKind AVar5;
  AddrOpnd *pAVar6;
  undefined4 *puVar7;
  IntConstOpnd *this_00;
  Opnd *pOVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_36;
  int local_34;
  
  pOVar8 = instr->m_src1;
  if (pOVar8 == constSrc) {
    pOVar8 = instr->m_src2;
  }
  bVar4 = ValueInfo::TryGetIntConstantValue(valuInfo,&local_34,false);
  if (!bVar4) {
    bVar4 = IR::Opnd::IsAddrOpnd(constSrc);
    if (bVar4) {
      pAVar6 = IR::Opnd::AsAddrOpnd(constSrc);
      AVar5 = pAVar6->addrOpndKind;
      if (((AVar5 != AddrOpndKindConstantVar) && (AVar5 != AddrOpndKindDynamicVar)) &&
         ((Var)(long)(int)pAVar6->m_address != pAVar6->m_address)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x195b,
                           "(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address))",
                           "addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address)");
        if (!bVar4) goto LAB_00433aed;
        *puVar7 = 0;
        AVar5 = pAVar6->addrOpndKind;
      }
      if ((AVar5 == AddrOpndKindDynamicVar) || (AVar5 == AddrOpndKindConstantVar)) {
        local_34 = Js::TaggedInt::ToInt32(pAVar6->m_address);
      }
      else {
        pAVar6 = IR::Opnd::AsAddrOpnd(constSrc);
        local_34 = Math::PointerCastToIntegral<int>(pAVar6->m_address);
      }
    }
    else {
      bVar4 = IR::Opnd::IsIntConstOpnd(constSrc);
      if (!bVar4) {
        return false;
      }
      this_00 = IR::Opnd::AsIntConstOpnd(constSrc);
      local_34 = IR::IntConstOpnd::AsInt32(this_00);
    }
  }
  OVar1 = instr->m_opcode;
  switch(OVar1) {
  case Add_I4:
    if (local_34 != 0) {
      return false;
    }
    goto LAB_00433a0f;
  case Sub_I4:
  case Div_I4:
  case DivU_I4:
  case Rem_I4:
  case RemU_I4:
  case Xor_I4:
    goto switchD_004339a2_caseD_1c1;
  case Mul_I4:
switchD_004339a2_caseD_1c2:
    if (local_34 != 1) {
      return false;
    }
    break;
  case And_I4:
    pOVar3 = pOVar8;
    goto joined_r0x00433a27;
  case Or_I4:
    pOVar3 = constSrc;
    constSrc = pOVar8;
joined_r0x00433a27:
    pOVar8 = pOVar3;
    if ((local_34 != -1) && (pOVar8 = constSrc, local_34 != 0)) {
switchD_004339a2_caseD_1c1:
      return false;
    }
    break;
  case Shl_I4:
  case Shr_I4:
  case ShrU_I4:
    if (local_34 != 0) {
      return false;
    }
LAB_00433a38:
    if (instr->m_src2 != constSrc) {
      return false;
    }
    pOVar8 = instr->m_src1;
    break;
  default:
    if (OVar1 == Mul_A) goto switchD_004339a2_caseD_1c2;
    if (OVar1 == Div_A) {
      if (local_34 != 1) {
        return false;
      }
      goto LAB_00433a38;
    }
    if (OVar1 != Add_A) {
      return false;
    }
    local_36 = (pOVar8->m_valueType).field_0;
    bVar4 = ValueType::IsInt((ValueType *)&local_36.field_0);
    if (!bVar4) {
      return false;
    }
    if (local_34 != 0) {
      return false;
    }
LAB_00433a0f:
    pOVar8 = instr->m_src1;
    if (instr->m_src1 == constSrc) {
      pOVar8 = instr->m_src2;
    }
  }
  CaptureByteCodeSymUses(this,instr);
  if (pOVar8 == instr->m_src1) {
    IR::Instr::FreeSrc2(instr);
  }
  else {
    if (pOVar8 != instr->m_src2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x19e1,"(src == instr->GetSrc2())","src == instr->GetSrc2()");
      if (!bVar4) {
LAB_00433aed:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pOVar8 = IR::Instr::UnlinkSrc2(instr);
    IR::Instr::ReplaceSrc1(instr,pOVar8);
  }
  instr->m_opcode = Ld_A;
  InvalidateInductionVariables(this,instr);
  return true;
}

Assistant:

bool
GlobOpt::OptConstPeep(IR::Instr *instr, IR::Opnd *constSrc, Value **pDstVal, ValueInfo *valuInfo)
{
    int32 value;
    IR::Opnd *src;
    IR::Opnd *nonConstSrc = (constSrc == instr->GetSrc1() ? instr->GetSrc2() : instr->GetSrc1());

    // Try to find the value from value info first
    if (valuInfo->TryGetIntConstantValue(&value))
    {
    }
    else if (constSrc->IsAddrOpnd())
    {
        IR::AddrOpnd *addrOpnd = constSrc->AsAddrOpnd();
#ifdef _M_X64
        Assert(addrOpnd->IsVar() || Math::FitsInDWord((size_t)addrOpnd->m_address));
#else
        Assert(sizeof(value) == sizeof(addrOpnd->m_address));
#endif

        if (addrOpnd->IsVar())
        {
            value = Js::TaggedInt::ToInt32(addrOpnd->m_address);
        }
        else
        {
            // We asserted that the address will fit in a DWORD above
            value = ::Math::PointerCastToIntegral<int32>(constSrc->AsAddrOpnd()->m_address);
        }
    }
    else if (constSrc->IsIntConstOpnd())
    {
        value = constSrc->AsIntConstOpnd()->AsInt32();
    }
    else
    {
        return false;
    }

    switch(instr->m_opcode)
    {
        // Can't do all Add_A because of string concats.
        // Sub_A cannot be transformed to a NEG_A because 0 - 0 != -0
    case Js::OpCode::Add_A:
        src = nonConstSrc;

        if (!src->GetValueType().IsInt())
        {
            // 0 + -0  != -0
            // "Foo" + 0 != "Foo
            return false;
        }
        // fall-through

    case Js::OpCode::Add_I4:
        if (value != 0)
        {
            return false;
        }
        if (constSrc == instr->GetSrc1())
        {
            src = instr->GetSrc2();
        }
        else
        {
            src = instr->GetSrc1();
        }
        break;

    case Js::OpCode::Mul_A:
    case Js::OpCode::Mul_I4:
        if (value == 0)
        {
            // -0 * 0 != 0
            return false;
        }
        else if (value == 1)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Div_A:
        if (value == 1 && constSrc == instr->GetSrc2())
        {
            src = instr->GetSrc1();
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Or_I4:
        if (value == -1)
        {
            src = constSrc;
        }
        else if (value == 0)
        {
            src = nonConstSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::And_I4:
        if (value == -1)
        {
            src = nonConstSrc;
        }
        else if (value == 0)
        {
            src = constSrc;
        }
        else
        {
            return false;
        }
        break;

    case Js::OpCode::Shl_I4:
    case Js::OpCode::ShrU_I4:
    case Js::OpCode::Shr_I4:
        if (value != 0 || constSrc != instr->GetSrc2())
        {
            return false;
        }
        src = instr->GetSrc1();
        break;

    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    if (src == instr->GetSrc1())
    {
        instr->FreeSrc2();
    }
    else
    {
        Assert(src == instr->GetSrc2());
        instr->ReplaceSrc1(instr->UnlinkSrc2());
    }

    instr->m_opcode = Js::OpCode::Ld_A;

    InvalidateInductionVariables(instr);

    return true;
}